

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O0

void __thiscall lightconf::scanner::skip_whitespace(scanner *this,bool ignore_comments)

{
  undefined1 uVar1;
  bool bVar2;
  byte local_133;
  token local_128;
  token local_e8;
  undefined1 local_a5;
  token local_98;
  token local_58;
  byte local_11;
  scanner *psStack_10;
  bool ignore_comments_local;
  scanner *this_local;
  
  local_11 = ignore_comments;
  psStack_10 = this;
  while( true ) {
    cur_token(&local_58,this);
    local_a5 = 0;
    uVar1 = local_58.type != whitespace_token;
    bVar2 = true;
    if ((bool)uVar1) {
      cur_token(&local_98,this);
      bVar2 = local_98.type == comment_token;
      local_a5 = uVar1;
      token::~token(&local_98);
      uVar1 = local_a5;
    }
    local_a5 = uVar1;
    token::~token(&local_58);
    if (!bVar2) break;
    cur_token(&local_e8,this);
    local_133 = 0;
    if (local_e8.type == comment_token) {
      local_133 = local_11 ^ 0xff;
    }
    token::~token(&local_e8);
    if (((local_133 & 1) != 0) &&
       (bVar2 = std::function::operator_cast_to_bool((function *)&this->params_), bVar2)) {
      cur_token(&local_128,this);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&(this->params_).comment_function,&local_128.string_value);
      token::~token(&local_128);
    }
    next_token(this);
  }
  return;
}

Assistant:

inline void scanner::skip_whitespace(bool ignore_comments) {
    while (cur_token().type == token_type::whitespace_token || cur_token().type == token_type::comment_token) {
        if (cur_token().type == token_type::comment_token && !ignore_comments) {
            if (params_.comment_function) {
                params_.comment_function(cur_token().string_value);
            }
        }
        next_token();
    }
}